

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeRemoveWindow
               (ImGuiDockNode *node,ImGuiWindow_conflict *window,ImGuiID save_dock_id)

{
  byte *pbVar1;
  ImVector<ImGuiWindow_*>_conflict *pIVar2;
  int iVar3;
  ImGuiWindow_conflict *pIVar4;
  ImGuiWindow_conflict **ppIVar5;
  ImGuiWindow_conflict **ppIVar6;
  ImGuiWindow_conflict *pIVar7;
  ImGuiViewportP_conflict1 *pIVar8;
  ImGuiContext_conflict1 *ctx;
  long lVar9;
  ImGuiWindow_conflict **ppIVar10;
  long lVar11;
  ImGuiWindow_conflict **ppIVar12;
  long lVar13;
  
  ctx = GImGui;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3506,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  if ((save_dock_id != 0) && (node->ID != save_dock_id)) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3509,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x3e1 = window->field_0x3e1 & 0xf6;
  window->DockId = save_dock_id;
  pbVar1 = (byte *)((long)&window->Flags + 3);
  *pbVar1 = *pbVar1 & 0xfe;
  pIVar4 = window->ParentWindow;
  if (pIVar4 != (ImGuiWindow_conflict *)0x0) {
    ppIVar5 = (pIVar4->DC).ChildWindows.Data;
    lVar9 = (long)(pIVar4->DC).ChildWindows.Size;
    ppIVar12 = ppIVar5;
    if (0 < lVar9) {
      do {
        if (*ppIVar12 == window) break;
        ppIVar12 = ppIVar12 + 1;
      } while (ppIVar12 < ppIVar5 + lVar9);
    }
    if (ppIVar12 < ppIVar5 + lVar9) {
      if (ppIVar12 < ppIVar5) {
LAB_001a4051:
        __assert_fail("it >= Data && it < Data + Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x71d,"T *ImVector<ImGuiWindow *>::erase(const T *) [T = ImGuiWindow *]");
      }
      memmove(ppIVar12,ppIVar12 + 1,(((ulong)~((long)ppIVar12 - (long)ppIVar5) >> 3) + lVar9) * 8);
      pIVar2 = &(pIVar4->DC).ChildWindows;
      pIVar2->Size = pIVar2->Size + -1;
    }
  }
  UpdateWindowParentAndRootLinks(window,window->Flags,(ImGuiWindow_conflict *)0x0);
  lVar9 = (long)(node->Windows).Size;
  if (0 < lVar9) {
    ppIVar5 = (node->Windows).Data;
    lVar11 = 0;
    ppIVar12 = ppIVar5;
    do {
      if (*ppIVar12 == window) {
        ppIVar6 = (node->Windows).Data;
        ppIVar10 = (ImGuiWindow_conflict **)((long)ppIVar6 - lVar11);
        if ((ppIVar5 <= ppIVar10) && (ppIVar10 < ppIVar5 + lVar9)) {
          lVar13 = (long)ppIVar6 - (long)ppIVar5;
          memmove((void *)((long)ppIVar12 + lVar13),(void *)((long)ppIVar12 + lVar13 + 8),
                  (((ulong)~(lVar13 - lVar11) >> 3) + lVar9) * 8);
          (node->Windows).Size = (node->Windows).Size + -1;
          if (node->VisibleWindow == window) {
            node->VisibleWindow = (ImGuiWindow_conflict *)0x0;
          }
          node->field_0xbe = node->field_0xbe | 2;
          if (((node->TabBar != (ImGuiTabBar *)0x0) &&
              (TabBarRemoveTab(node->TabBar,window->ID),
              (node->Windows).Size < (int)(((node->MergedFlags & 0x800) == 0) + 1))) &&
             (node->TabBar != (ImGuiTabBar *)0x0)) {
            IM_DELETE<ImGuiTabBar>(node->TabBar);
            node->TabBar = (ImGuiTabBar *)0x0;
          }
          iVar3 = (node->Windows).Size;
          if (iVar3 == 1) {
            if (((node->MergedFlags & 0x800) == 0) &&
               (pIVar4 = node->HostWindow, pIVar4 != (ImGuiWindow_conflict *)0x0)) {
              pIVar7 = *(node->Windows).Data;
              if ((pIVar4->ViewportOwned == true) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
                pIVar8 = pIVar4->Viewport;
                if (pIVar8->Window != pIVar4) {
                  __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                                ,0x353a,
                                "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)"
                               );
                }
                pIVar8->Window = pIVar7;
                (pIVar8->super_ImGuiViewport).ID = pIVar7->ID;
              }
              pIVar7->Collapsed = pIVar4->Collapsed;
            }
          }
          else if (((iVar3 == 0) && ((node->MergedFlags & 0xc00) == 0)) &&
                  (window->DockId != node->ID)) {
            DockContextRemoveNode(ctx,node,true);
            return;
          }
          DockNodeUpdateVisibleFlag(node);
          return;
        }
        goto LAB_001a4051;
      }
      ppIVar12 = ppIVar12 + 1;
      lVar11 = lVar11 + -8;
    } while (lVar9 * 8 + lVar11 != 0);
  }
  __assert_fail("erased",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x351e,"void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)")
  ;
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindowDockTree == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    window->Flags &= ~ImGuiWindowFlags_ChildWindow;
    if (window->ParentWindow)
        window->ParentWindow->DC.ChildWindows.find_erase(window);
    UpdateWindowParentAndRootLinks(window, window->Flags, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    if (!erased)
        IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IMGUI_DEBUG_LOG_VIEWPORT("Node %08X transfer Viewport %08X=>%08X for Window '%s'\n", node->ID, node->HostWindow->Viewport->ID, remaining_window->ID, remaining_window->Name);
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}